

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_clone(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  HSQUIRRELVM in_RDI;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_00000048;
  SQObjectPtr *in_stack_00000050;
  SQVM *in_stack_00000058;
  SQInteger in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  stack_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  SQVM::PushNull((SQVM *)0x117e5c);
  stack_get(in_RDI,in_stack_ffffffffffffffc8);
  bVar1 = SQVM::Clone(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    SQVM::Pop((SQVM *)0x117ea1);
    local_8 = -1;
  }
  return local_8;
}

Assistant:

SQRESULT sq_clone(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v,idx);
    v->PushNull();
    if(!v->Clone(o, stack_get(v, -1))){
        v->Pop();
        return SQ_ERROR;
    }
    return SQ_OK;
}